

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureBarrierTests.cpp
# Opt level: O1

char * gl4cts::apiToTestName(API api)

{
  bool *pbVar1;
  char *pcVar2;
  
  pcVar2 = glcts::fixed_sample_locations_values + 1;
  if (api == API_GL_ARB_texture_barrier) {
    pcVar2 = "texture_barrier_ARB";
  }
  pbVar1 = (bool *)0x1af01c1;
  if (api != API_GL_45core) {
    pbVar1 = (bool *)pcVar2;
  }
  return pbVar1;
}

Assistant:

const char* apiToTestName(TextureBarrierTests::API api)
{
	switch (api)
	{
	case TextureBarrierTests::API_GL_45core:
		return "texture_barrier";
	case TextureBarrierTests::API_GL_ARB_texture_barrier:
		return "texture_barrier_ARB";
	}
	DE_ASSERT(0);
	return "";
}